

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall ON_Annotation::ON_Annotation(ON_Annotation *this,AnnotationType annotation_type)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ON_UUID *pOVar3;
  AnnotationType annotation_type_local;
  ON_Annotation *this_local;
  
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)0x0;
  (this->super_ON_Geometry).super_ON_Object.m_userdata_list = (ON_UserData *)0x0;
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b67ac8;
  this->m_annotation_type = annotation_type;
  this->m_allow_text_scaling = true;
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_reserved4 = 0;
  pOVar3 = ON_ModelComponent::Id(&ON_DimStyle::Default.super_ON_ModelComponent);
  uVar1 = pOVar3->Data2;
  uVar2 = pOVar3->Data3;
  (this->m_dimstyle_id).Data1 = pOVar3->Data1;
  (this->m_dimstyle_id).Data2 = uVar1;
  (this->m_dimstyle_id).Data3 = uVar2;
  *(undefined8 *)(this->m_dimstyle_id).Data4 = *(undefined8 *)pOVar3->Data4;
  memcpy(&this->m_plane,&ON_Plane::World_xy,0x80);
  (this->m_horizontal_direction).x = ON_2dVector::XAxis.x;
  (this->m_horizontal_direction).y = ON_2dVector::XAxis.y;
  this->m_text = (ON_TextContent *)0x0;
  this->m_override_dimstyle = (ON_DimStyle *)0x0;
  this->m_parent_dimstyle_content_version_number = 0;
  ON_BoundingBoxCache::ON_BoundingBoxCache(&this->m_bbox_cache);
  return;
}

Assistant:

ON_Annotation::ON_Annotation(ON::AnnotationType annotation_type)
  : ON_Geometry()
  , m_annotation_type(annotation_type)
{}